

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O2

void result_tests::ExpectSuccess<bilingual_str,bilingual_str>
               (Result<bilingual_str> *result,bilingual_str *str,bilingual_str *args)

{
  T *pTVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  T **ppTVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  T *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  T *local_e8;
  undefined1 local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ExpectResult<bilingual_str>(result,true,str);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x41;
  file.m_begin = (iterator)&local_88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_a0 = "";
  ppTVar3 = &local_e8;
  local_e8 = (T *)CONCAT71(local_e8._1_7_,
                           *(__index_type *)
                            ((long)&(result->m_variant).
                                    super__Variant_base<bilingual_str,_bilingual_str>.
                                    super__Move_assign_alias<bilingual_str,_bilingual_str>.
                                    super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                                    super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                                    super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                                    super__Variant_storage_alias<bilingual_str,_bilingual_str> +
                            0x40) == '\x01');
  local_130 = (T *)CONCAT71(local_130._1_7_,1);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            ((bilingual_str *)local_78,&local_a8,0x41,1,2,ppTVar3,"result.has_value()",&local_130,
             "true");
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)ppTVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x42;
  file_00.m_begin = (iterator)&local_b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,msg_00
            );
  local_e0 = 0;
  local_e8 = (T *)&PTR__lazy_ostream_01139f30;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_f0 = "";
  pTVar1 = util::Result<bilingual_str>::value(result);
  bilingual_str::bilingual_str((bilingual_str *)local_78,args);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
            (&local_e8,&local_f8,0x42,1,2,pTVar1,"result.value()",(bilingual_str *)local_78,
             "T{std::forward<Args>(args)...}");
  bilingual_str::~bilingual_str((bilingual_str *)local_78);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pTVar1;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
             msg_01);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_120 = "";
  local_e8 = util::Result<bilingual_str>::value(result);
  local_130 = util::Result<bilingual_str>::value(result);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str_const*,bilingual_str_const*>
            (local_78,&local_128,0x43,1,2,&local_e8,"&result.value()",&local_130,"&*result");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExpectSuccess(const util::Result<T>& result, const bilingual_str& str, Args&&... args)
{
    ExpectResult(result, true, str);
    BOOST_CHECK_EQUAL(result.has_value(), true);
    BOOST_CHECK_EQUAL(result.value(), T{std::forward<Args>(args)...});
    BOOST_CHECK_EQUAL(&result.value(), &*result);
}